

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  cmSourceGroup *pcVar1;
  pointer ppcVar2;
  bool bVar3;
  string *psVar4;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  cmSourceGroup *this_00;
  pointer ppcVar5;
  cmAlphaNum local_108;
  string linkName3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  cmAlphaNum local_a0;
  string local_70;
  string linkName4;
  
  pcVar1 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (this_00 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pcVar1; this_00 = this_00 + 1)
  {
    local_a0.View_._M_str = (linkName->_M_dataplus)._M_p;
    local_a0.View_._M_len = linkName->_M_string_length;
    local_108.View_._M_len = 1;
    local_108.View_._M_str = local_108.Digits_;
    local_108.Digits_[0] = '/';
    psVar4 = cmSourceGroup::GetFullName_abi_cxx11_(this_00);
    cmStrCat<std::__cxx11::string>(&linkName3,&local_a0,&local_108,psVar4);
    local_a0.View_._M_len = CONCAT71(local_a0.View_._M_len._1_7_,0x5c);
    local_108.View_._M_len = CONCAT71(local_108.View_._M_len._1_7_,0x2f);
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )linkName3._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(linkName3._M_dataplus._M_p + linkName3._M_string_length),(char *)&local_a0,
               (char *)&local_108);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"virtual:/virtual",(allocator<char> *)&local_108);
    AppendLinkedResource(xml,&linkName3,(string *)&local_a0,VirtualFolder);
    std::__cxx11::string::~string((string *)&local_a0);
    sourceGroups_00 = cmSourceGroup::GetGroupChildren(this_00);
    if ((sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
        .super__Vector_impl_data._M_start !=
        (sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      WriteGroups(this,sourceGroups_00,linkName,xml);
    }
    __x = cmSourceGroup::GetSourceFiles(this_00);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(&sFiles,__x);
    ppcVar2 = sFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar5 = sFiles.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar2;
        ppcVar5 = ppcVar5 + 1) {
      psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar5);
      bVar3 = cmsys::SystemTools::FileIsDirectory(psVar4);
      if (!bVar3) {
        local_a0.View_._M_len = linkName3._M_string_length;
        local_a0.View_._M_str = linkName3._M_dataplus._M_p;
        local_108.View_._M_len = 1;
        local_108.View_._M_str = local_108.Digits_;
        local_108.Digits_[0] = '/';
        cmsys::SystemTools::GetFilenameName(&local_70,psVar4);
        cmStrCat<std::__cxx11::string>(&linkName4,&local_a0,&local_108,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string((string *)&local_a0,(string *)psVar4);
        AppendLinkedResource(xml,&linkName4,(string *)&local_a0,LinkToFile);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&linkName4);
      }
    }
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              (&sFiles.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
    std::__cxx11::string::~string((string *)&linkName3);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (cmSourceGroup const& sg : sourceGroups) {
    std::string linkName3 = cmStrCat(linkName, '/', sg.GetFullName());

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    cmExtraEclipseCDT4Generator::AppendLinkedResource(
      xml, linkName3, "virtual:/virtual", VirtualFolder);
    std::vector<cmSourceGroup> const& children = sg.GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sg.GetSourceFiles();
    for (cmSourceFile const* file : sFiles) {
      std::string const& fullPath = file->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 =
          cmStrCat(linkName3, '/', cmSystemTools::GetFilenameName(fullPath));
        cmExtraEclipseCDT4Generator::AppendLinkedResource(
          xml, linkName4,
          cmExtraEclipseCDT4Generator::GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}